

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

uint8_t get_mask(int field)

{
  uint in_EDI;
  uint8_t local_1;
  
  if (in_EDI == 2) {
    local_1 = '\x01';
  }
  else {
    if (in_EDI != 0x100) {
      fprintf(_stderr,"%s:%d: Unsupported field size %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/test_utils/./utils.h"
              ,0x1b,(ulong)in_EDI);
      exit(1);
    }
    local_1 = 0xff;
  }
  return local_1;
}

Assistant:

UNUSED
static uint8_t get_mask(int field)
{
	switch(field) {
	case 2:		return 0x1;	break;
	case 256:	return 0xff;	break;
	default:
		fprintf(stderr, "%s:%d: Unsupported field size %d.\n",
			__FILE__, __LINE__, field);
		exit(EXIT_FAILURE);
	}
	return 0; // Not reached.
}